

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaV_tostring(lua_State *L,StkId obj)

{
  size_t l;
  GCObject *pGVar1;
  bool bVar2;
  TValue *i_o;
  lua_Number n;
  char s [32];
  StkId obj_local;
  lua_State *L_local;
  
  bVar2 = obj->tt == 3;
  if (bVar2) {
    sprintf((char *)&n,"%.14g",(obj->value).gc);
    l = strlen((char *)&n);
    pGVar1 = (GCObject *)luaS_newlstr(L,(char *)&n,l);
    (obj->value).gc = pGVar1;
    obj->tt = 4;
  }
  L_local._4_4_ = (uint)bVar2;
  return L_local._4_4_;
}

Assistant:

static int luaV_tostring(lua_State*L,StkId obj){
if(!ttisnumber(obj))
return 0;
else{
char s[32];
lua_Number n=nvalue(obj);
lua_number2str(s,n);
setsvalue(L,obj,luaS_new(L,s));
return 1;
}
}